

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_deserialize_set_element
          (t_c_glib_generator *this,ostream *out,t_set *tset,string *prefix,int error_ret)

{
  undefined8 type;
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  byte local_1f2;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  t_field felem;
  undefined1 local_b0 [8];
  string telem_ptr;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  string elem;
  t_type *telem;
  int error_ret_local;
  string *prefix_local;
  t_set *tset_local;
  ostream *out_local;
  t_c_glib_generator *this_local;
  
  elem.field_2._8_8_ = t_set::get_elem_type(tset);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"_elem",&local_79);
  t_generator::tmp((string *)local_58,(t_generator *)this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  bVar1 = (**(code **)(*(long *)elem.field_2._8_8_ + 0x30))();
  local_1f2 = 1;
  if ((bVar1 & 1) == 0) {
    local_1f2 = (**(code **)(*(long *)elem.field_2._8_8_ + 0x28))();
    local_1f2 = local_1f2 ^ 0xff;
  }
  pcVar2 = "*";
  if ((local_1f2 & 1) != 0) {
    pcVar2 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,pcVar2,(allocator *)&felem.field_0xaf);
  std::allocator<char>::~allocator((allocator<char> *)&felem.field_0xaf);
  declare_local_variable(this,out,(t_type *)elem.field_2._8_8_,(string *)local_58,true);
  type = elem.field_2._8_8_;
  std::operator+(&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  t_field::t_field((t_field *)local_168,(t_type *)type,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"",&local_1d1);
  generate_deserialize_field(this,out,(t_field *)local_168,&local_1a8,&local_1d0,error_ret,true);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"if (");
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3," && ");
  poVar3 = std::operator<<(poVar3,(string *)local_58);
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"g_hash_table_insert ((GHashTable *) ");
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3,", (gpointer) ");
  poVar3 = std::operator<<(poVar3,(string *)local_58);
  poVar3 = std::operator<<(poVar3,", (gpointer) ");
  poVar3 = std::operator<<(poVar3,(string *)local_58);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  t_field::~t_field((t_field *)local_168);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void t_c_glib_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix,
                                                          int error_ret) {
  t_type* telem = tset->get_elem_type();
  string elem = tmp("_elem");
  string telem_ptr = telem->is_string() || !telem->is_base_type() ? "" : "*";

  declare_local_variable(out, telem, elem, true);

  t_field felem(telem, telem_ptr + elem);
  generate_deserialize_field(out, &felem, "", "", error_ret);

  indent(out) << "if (" << prefix << " && " << elem << ")" << endl;
  indent_up();
  indent(out) << "g_hash_table_insert ((GHashTable *) " << prefix << ", (gpointer) " << elem
              << ", (gpointer) " << elem << ");" << endl;
  indent_down();
}